

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O2

int pmain(lua_State *L)

{
  char cVar1;
  Instruction *pIVar2;
  LocVar *pLVar3;
  Upvaldesc *pUVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  void *pvVar10;
  char *pcVar11;
  FILE *__stream;
  ulong extraout_RAX;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  byte bVar16;
  uint full;
  uint uVar17;
  code *pcVar18;
  char *pcVar19;
  ulong uVar20;
  Proto *pPVar21;
  Proto *pPVar22;
  char *pcVar23;
  char *pcVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  uint i;
  char *pcVar30;
  uint local_2c;
  
  uVar28 = 0;
  uVar9 = lua_tointegerx(L,1,(int *)0x0);
  pvVar10 = lua_touserdata(L,2);
  tmname = L->l_G->tmname;
  uVar29 = (uint)uVar9;
  pcVar11 = (char *)(uVar9 & 0xffffffff);
  iVar6 = lua_checkstack(L,uVar29);
  full = (uint)pcVar11;
  if (iVar6 == 0) {
    fatal("too many input files");
LAB_0010386c:
    cannot("open");
  }
  else {
    uVar26 = 0;
    if (0 < (int)uVar29) {
      uVar26 = uVar9 & 0xffffffff;
    }
    do {
      full = (uint)pcVar11;
      if (uVar26 == uVar28) goto LAB_00103724;
      pcVar11 = *(char **)((long)pvVar10 + uVar28 * 8);
      if ((*pcVar11 == '-') && (pcVar11[1] == '\0')) {
        pcVar11 = (char *)0x0;
      }
      iVar6 = luaL_loadfilex(L,pcVar11,(char *)0x0);
      uVar28 = uVar28 + 1;
    } while (iVar6 == 0);
    do {
      full = 0xffffffff;
      pcVar11 = lua_tolstring(L,-1,(size_t *)0x0);
      fatal(pcVar11);
LAB_00103724:
      if (uVar29 == 1) {
        pPVar22 = *(Proto **)(*(long *)((L->top).offset + -0x10) + 0x18);
        goto LAB_00103736;
      }
      pcVar18 = reader;
      local_2c = uVar29;
      iVar6 = lua_load(L,reader,&local_2c,"=(luac)",(char *)0x0);
    } while (iVar6 != 0);
    pPVar22 = *(Proto **)(*(long *)((L->top).offset + -0x10) + 0x18);
    lVar15 = (ulong)~uVar29 << 0x20;
    for (uVar9 = 0; full = (uint)pcVar18, uVar26 != uVar9; uVar9 = uVar9 + 1) {
      pcVar18 = (code *)pPVar22->p;
      *(Proto **)((long)pcVar18 + uVar9 * 8) =
           *(Proto **)(*(long *)((long)(L->top).p + (lVar15 >> 0x1c)) + 0x18);
      if (0 < pPVar22->p[uVar9]->sizeupvalues) {
        pPVar22->p[uVar9]->upvalues->instack = '\0';
      }
      lVar15 = lVar15 + 0x100000000;
    }
LAB_00103736:
    if (listing != 0) {
      full = (uint)(1 < listing);
      PrintFunction(pPVar22,(uint)(1 < listing));
    }
    if (dumping != '\0') {
      return 0;
    }
    __stream = _stdout;
    if (output != (char *)0x0) {
      full = 0x11a3c7;
      __stream = fopen64(output,"wb");
    }
    if (__stream == (FILE *)0x0) goto LAB_0010386c;
    luaU_dump(L,pPVar22,writer,__stream,(uint)stripping);
    full = (uint)pPVar22;
    iVar6 = ferror(__stream);
    if (iVar6 == 0) {
      iVar6 = fclose(__stream);
      if (iVar6 == 0) {
        return 0;
      }
      goto LAB_00103884;
    }
  }
  cannot("write");
LAB_00103884:
  pPVar22 = (Proto *)0x11ab3b;
  cannot("close");
  pcVar11 = "=?";
  if (pPVar22->source != (TString *)0x0) {
    pcVar11 = pPVar22->source->contents;
  }
  cVar1 = *pcVar11;
  if (cVar1 == '\x1b') {
    pcVar11 = "(bstring)";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    pcVar11 = pcVar11 + 1;
  }
  else {
    pcVar11 = "(string)";
  }
  uVar29 = pPVar22->sizep;
  pcVar19 = "function";
  if (pPVar22->linedefined == 0) {
    pcVar19 = "main";
  }
  pcVar30 = "s";
  pcVar23 = "s";
  if (pPVar22->sizecode == 1) {
    pcVar23 = "";
  }
  printf("\n%s <%s:%d,%d> (%d instruction%s at %p)\n",pcVar19,pcVar11,
         (ulong)(uint)pPVar22->linedefined,(ulong)(uint)pPVar22->lastlinedefined,
         (ulong)(uint)pPVar22->sizecode,pcVar23,pPVar22);
  pcVar11 = "+";
  if (pPVar22->is_vararg == '\0') {
    pcVar11 = "";
  }
  pcVar19 = "s";
  if (pPVar22->numparams == 1) {
    pcVar19 = "";
  }
  pcVar23 = "s";
  if (pPVar22->maxstacksize == 1) {
    pcVar23 = "";
  }
  pcVar24 = "s";
  if (pPVar22->sizeupvalues == 1) {
    pcVar24 = "";
  }
  printf("%d%s param%s, %d slot%s, %d upvalue%s, ",(ulong)pPVar22->numparams,pcVar11,pcVar19,
         (ulong)pPVar22->maxstacksize,pcVar23,(ulong)(uint)pPVar22->sizeupvalues,pcVar24);
  pcVar11 = "s";
  if (pPVar22->sizelocvars == 1) {
    pcVar11 = "";
  }
  pcVar19 = "s";
  if (pPVar22->sizek == 1) {
    pcVar19 = "";
  }
  if (pPVar22->sizep == 1) {
    pcVar30 = "";
  }
  printf("%d local%s, %d constant%s, %d function%s\n",(ulong)(uint)pPVar22->sizelocvars,pcVar11,
         (ulong)(uint)pPVar22->sizek,pcVar19,(ulong)(uint)pPVar22->sizep,pcVar30,pcVar24);
  pIVar2 = pPVar22->code;
  uVar9 = (ulong)(uint)pPVar22->sizecode;
  if (pPVar22->sizecode < 1) {
    uVar9 = 0;
  }
  uVar28 = uVar9;
  for (uVar26 = 0; uVar9 != uVar26; uVar26 = uVar26 + 1) {
    uVar8 = pIVar2[uVar26];
    iVar6 = (int)uVar26;
    uVar7 = luaG_getfuncline(pPVar22,iVar6);
    printf("\t%d\t",(ulong)(iVar6 + 1));
    if ((int)uVar7 < 1) {
      printf("[-]\t");
    }
    else {
      printf("[%d]\t",(ulong)uVar7);
    }
    uVar7 = uVar8 & 0x7f;
    printf("%-9s\t",opnames[uVar7]);
    if (0x52 < uVar7) goto switchD_00103acf_caseD_47;
    uVar17 = uVar8 >> 7;
    uVar20 = (ulong)(uVar17 & 0xff);
    uVar27 = uVar8 >> 0x10 & 0xff;
    i = uVar8 >> 0x18;
    uVar25 = uVar8 >> 0xf;
    uVar13 = (ulong)(uVar27 - 0x7f);
    uVar12 = (ulong)(i - 0x7f);
    uVar14 = uVar25 & 1;
    uVar28 = (ulong)uVar14;
    pcVar11 = "k";
    switch(uVar7) {
    case 0:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
      uVar28 = (ulong)uVar27;
      goto LAB_00103e09;
    case 1:
    case 2:
      uVar28 = (ulong)(uVar25 - 0xffff);
      goto LAB_00103e09;
    case 3:
      printf("%d %d",uVar20,(ulong)uVar25,uVar12,"k");
      printf("\t; ");
      i = uVar25;
      goto LAB_00103b13;
    case 4:
      printf("%d",uVar20,uVar13,uVar12,"k");
      printf("\t; ");
      i = pIVar2[uVar26 + 1] >> 7;
      goto LAB_00103b13;
    case 5:
    case 6:
    case 7:
    case 0x36:
    case 0x37:
    case 0x48:
    case 0x51:
      pcVar11 = "%d";
      goto LAB_00104107;
    case 8:
      printf("%d %d",uVar20,(ulong)uVar27,uVar12,"k");
      uVar27 = uVar27 + 1;
      pcVar11 = "\t; %d out";
      goto LAB_00103ee3;
    case 9:
    case 10:
      printf("%d %d",uVar20,(ulong)uVar27,uVar12,"k");
      lVar15 = *(long *)((long)&pPVar22->upvalues->name + (ulong)(uVar27 << 4));
      pPVar21 = (Proto *)"-";
      if (lVar15 != 0) {
        pPVar21 = (Proto *)(lVar15 + 0x18);
      }
      goto LAB_00103f42;
    case 0xb:
      printf("%d %d %d",uVar20,(ulong)uVar27,(ulong)i,"k");
      lVar15 = *(long *)((long)&pPVar22->upvalues->name + (ulong)(uVar27 << 4));
      pcVar11 = "-";
      if (lVar15 != 0) {
        pcVar11 = (char *)(lVar15 + 0x18);
      }
      printf("\t; %s",pcVar11);
      putchar(0x20);
      goto LAB_00103b13;
    default:
      uVar13 = (ulong)uVar27;
      uVar28 = (ulong)i;
      goto LAB_00103b99;
    case 0xe:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
      printf("%d %d %d",uVar20,(ulong)uVar27,(ulong)i,"k");
LAB_00103afd:
      printf("\t; ");
      goto LAB_00103b13;
    case 0xf:
      if (uVar14 == 0) {
        pcVar11 = "";
      }
      printf("%d %d %d%s",uVar20,(ulong)uVar27,(ulong)i,pcVar11);
      lVar15 = *(long *)((long)&pPVar22->upvalues->name + (ulong)((uVar17 & 0xff) << 4));
      pcVar11 = "-";
      if (lVar15 != 0) {
        pcVar11 = (char *)(lVar15 + 0x18);
      }
      printf("\t; %s",pcVar11);
      putchar(0x20);
      goto LAB_00103e78;
    case 0x10:
    case 0x11:
    case 0x14:
      if (uVar14 == 0) {
        pcVar11 = "";
      }
      printf("%d %d %d%s",uVar20,(ulong)uVar27,(ulong)i,pcVar11);
      if (uVar14 != 0) goto LAB_00103afd;
      break;
    case 0x12:
      if (uVar14 == 0) {
        pcVar11 = "";
      }
      printf("%d %d %d%s",uVar20,(ulong)uVar27,(ulong)i,pcVar11);
      printf("\t; ");
LAB_00103e78:
      PrintConstant(pPVar22,uVar27);
      if (uVar14 != 0) {
        putchar(0x20);
        goto LAB_00103b13;
      }
      break;
    case 0x13:
      printf("%d %d %d",uVar20,(ulong)uVar27,(ulong)i,"k");
LAB_00104046:
      uVar20 = (ulong)(i + (pIVar2[uVar26 + 1] & 0x3fffff80) * 2);
      pcVar11 = "\t; %d";
      goto LAB_00104107;
    case 0x15:
    case 0x20:
    case 0x21:
      uVar13 = (ulong)uVar27;
      uVar28 = uVar12;
      goto LAB_00103b99;
    case 0x2e:
      printf("%d %d %d",uVar20,(ulong)uVar27,(ulong)i,"k");
      pPVar21 = (Proto *)tmname[i]->contents;
LAB_00103f42:
      pcVar11 = "\t; %s";
LAB_00103f49:
      printf(pcVar11,pPVar21);
      break;
    case 0x2f:
      printf("%d %d %d %d",uVar20,uVar13,(ulong)i,uVar28);
      printf("\t; %s",tmname[i]->contents);
      goto LAB_0010401b;
    case 0x30:
      printf("%d %d %d %d",uVar20,(ulong)uVar27,(ulong)i,uVar28);
      printf("\t; %s ",tmname[i]->contents);
      PrintConstant(pPVar22,uVar27);
LAB_0010401b:
      if (uVar14 != 0) {
        pcVar11 = " flip";
LAB_001040f1:
        printf(pcVar11);
      }
      break;
    case 0x38:
      printf("%d",(ulong)(uVar17 - 0xffffff),uVar13,uVar12,"k");
      uVar20 = (ulong)((iVar6 + (uVar8 >> 7)) - 0xfffffd);
      goto LAB_001040cb;
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x43:
      uVar13 = (ulong)uVar27;
      goto LAB_00103b99;
    case 0x3c:
      printf("%d %d %d",uVar20,(ulong)uVar27,uVar28,"k");
      printf("\t; ");
      i = uVar27;
LAB_00103b13:
      PrintConstant(pPVar22,i);
      break;
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x41:
LAB_00103b99:
      printf("%d %d %d",uVar20,uVar13,uVar28,"k");
      break;
    case 0x42:
      goto LAB_00103e09;
    case 0x44:
      printf("%d %d %d",uVar20,(ulong)uVar27,(ulong)i,"k");
      printf("\t; ");
      if (uVar27 == 0) {
        pcVar11 = "all in ";
        goto LAB_001040db;
      }
      printf("%d in ",(ulong)(uVar27 - 1));
      goto LAB_001040e2;
    case 0x45:
      if (uVar14 == 0) {
        pcVar11 = "";
      }
      printf("%d %d %d%s",uVar20,(ulong)uVar27,(ulong)i,pcVar11);
      uVar27 = uVar27 - 1;
      pcVar11 = "\t; %d in";
LAB_00103ee3:
      uVar20 = (ulong)uVar27;
      goto LAB_00104107;
    case 0x46:
      if (uVar14 == 0) {
        pcVar11 = "";
      }
      printf("%d %d %d%s",uVar20,(ulong)uVar27,(ulong)i,pcVar11);
      printf("\t; ");
      if (uVar27 != 0) {
        uVar27 = uVar27 - 1;
        pcVar11 = "%d out";
        goto LAB_00103ee3;
      }
      goto LAB_001040ea;
    case 0x47:
      break;
    case 0x49:
    case 0x4d:
      printf("%d %d",uVar20,(ulong)uVar25,uVar12,"k");
      uVar20 = (ulong)((iVar6 - uVar25) + 2);
      goto LAB_001040cb;
    case 0x4a:
      printf("%d %d",uVar20,(ulong)uVar25,uVar12,"k");
      uVar20 = (ulong)(iVar6 + (uVar8 >> 0xf) + 3);
      pcVar11 = "\t; exit to %d";
      goto LAB_00104107;
    case 0x4b:
      printf("%d %d",uVar20,(ulong)uVar25,uVar12,"k");
      uVar20 = (ulong)(iVar6 + (uVar8 >> 0xf) + 2);
LAB_001040cb:
      pcVar11 = "\t; to %d";
      goto LAB_00104107;
    case 0x4c:
      uVar28 = (ulong)i;
LAB_00103e09:
      printf("%d %d",uVar20,uVar28,uVar12,"k");
      break;
    case 0x4e:
      printf("%d %d %d",uVar20,(ulong)uVar27,(ulong)i,"k");
      if (uVar14 != 0) goto LAB_00104046;
      break;
    case 0x4f:
      printf("%d %d",uVar20,(ulong)uVar25,uVar12,"k");
      pPVar21 = pPVar22->p[uVar25];
      pcVar11 = "\t; %p";
      goto LAB_00103f49;
    case 0x50:
      printf("%d %d",uVar20,(ulong)i,uVar12,"k");
      pcVar11 = "\t; ";
LAB_001040db:
      printf(pcVar11);
LAB_001040e2:
      if (0xffffff < uVar8) {
        pcVar11 = "%d out";
        uVar20 = (ulong)(i - 1);
        goto LAB_00104107;
      }
LAB_001040ea:
      pcVar11 = "all out";
      goto LAB_001040f1;
    case 0x52:
      pcVar11 = "%d";
      uVar20 = (ulong)uVar17;
LAB_00104107:
      printf(pcVar11,uVar20);
    }
switchD_00103acf_caseD_47:
    uVar8 = putchar(10);
    uVar28 = (ulong)uVar8;
  }
  if (full != 0) {
    uVar8 = pPVar22->sizek;
    printf("constants (%d) for %p:\n",(ulong)uVar8);
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar9 = 0;
    }
    lVar15 = 8;
    for (uVar28 = 0; uVar9 != uVar28; uVar28 = uVar28 + 1) {
      printf("\t%d\t",uVar28 & 0xffffffff);
      bVar16 = *(byte *)((long)&pPVar22->k->value_ + lVar15) & 0x3f;
      switch(bVar16) {
      case 0:
        iVar6 = 0x4e;
        break;
      case 1:
switchD_0010419b_caseD_1:
        iVar6 = 0x42;
        break;
      case 2:
switchD_0010419b_caseD_2:
        printf("?%d");
        goto LAB_001041d4;
      case 3:
        iVar6 = 0x49;
        break;
      case 4:
switchD_0010419b_caseD_4:
        iVar6 = 0x53;
        break;
      default:
        if (bVar16 == 0x11) goto switchD_0010419b_caseD_1;
        if (bVar16 != 0x13) {
          if (bVar16 == 0x14) goto switchD_0010419b_caseD_4;
          goto switchD_0010419b_caseD_2;
        }
        iVar6 = 0x46;
      }
      putchar(iVar6);
LAB_001041d4:
      putchar(9);
      PrintConstant(pPVar22,(int)uVar28);
      putchar(10);
      lVar15 = lVar15 + 0x10;
    }
    uVar8 = pPVar22->sizelocvars;
    printf("locals (%d) for %p:\n",(ulong)uVar8);
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar9 = 0;
    }
    lVar15 = 0xc;
    for (uVar28 = 0; uVar9 != uVar28; uVar28 = uVar28 + 1) {
      pLVar3 = pPVar22->locvars;
      printf("\t%d\t%s\t%d\t%d\n",uVar28 & 0xffffffff,*(long *)((long)pLVar3 + lVar15 + -0xc) + 0x18
             ,(ulong)(*(int *)((long)pLVar3 + lVar15 + -4) + 1),
             (ulong)(*(int *)((long)&pLVar3->varname + lVar15) + 1));
      lVar15 = lVar15 + 0x10;
    }
    uVar8 = pPVar22->sizeupvalues;
    uVar7 = printf("upvalues (%d) for %p:\n",(ulong)uVar8);
    uVar9 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar9 = 0;
    }
    lVar15 = 9;
    for (uVar26 = 0; uVar28 = (ulong)uVar7, uVar9 != uVar26; uVar26 = uVar26 + 1) {
      pUVar4 = pPVar22->upvalues;
      lVar5 = *(long *)((long)pUVar4 + lVar15 + -9);
      pcVar11 = (char *)(lVar5 + 0x18);
      if (lVar5 == 0) {
        pcVar11 = "-";
      }
      uVar7 = printf("\t%d\t%s\t%d\t%d\n",uVar26 & 0xffffffff,pcVar11,
                     (ulong)*(byte *)((long)pUVar4 + lVar15 + -1),
                     (ulong)*(byte *)((long)&pUVar4->name + lVar15));
      lVar15 = lVar15 + 0x10;
    }
  }
  uVar26 = 0;
  uVar9 = (ulong)uVar29;
  if ((int)uVar29 < 1) {
    uVar9 = uVar26;
  }
  for (; uVar9 != uVar26; uVar26 = uVar26 + 1) {
    PrintFunction(pPVar22->p[uVar26],full);
    uVar28 = extraout_RAX;
  }
  return (int)uVar28;
}

Assistant:

static int pmain(lua_State* L)
{
 int argc=(int)lua_tointeger(L,1);
 char** argv=(char**)lua_touserdata(L,2);
 const Proto* f;
 int i;
 tmname=G(L)->tmname;
 if (!lua_checkstack(L,argc)) fatal("too many input files");
 for (i=0; i<argc; i++)
 {
  const char* filename=IS("-") ? NULL : argv[i];
  if (luaL_loadfile(L,filename)!=LUA_OK) fatal(lua_tostring(L,-1));
 }
 f=combine(L,argc);
 if (listing) luaU_print(f,listing>1);
 if (dumping)
 {
  FILE* D= (output==NULL) ? stdout : fopen(output,"wb");
  if (D==NULL) cannot("open");
  lua_lock(L);
  luaU_dump(L,f,writer,D,stripping);
  lua_unlock(L);
  if (ferror(D)) cannot("write");
  if (fclose(D)) cannot("close");
 }
 return 0;
}